

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-room.c
# Opt level: O0

_Bool check_for_unreserved_blocks(wchar_t by1,wchar_t bx1,wchar_t by2,wchar_t bx2)

{
  wchar_t local_24;
  wchar_t local_20;
  wchar_t bx;
  wchar_t by;
  wchar_t bx2_local;
  wchar_t by2_local;
  wchar_t bx1_local;
  wchar_t by1_local;
  
  if ((by1 < L'\0') || (dun->row_blocks <= by2)) {
    bx1_local._3_1_ = false;
  }
  else if ((bx1 < L'\0') || (local_20 = by1, dun->col_blocks <= bx2)) {
    bx1_local._3_1_ = false;
  }
  else {
    for (; local_24 = bx1, local_20 <= by2; local_20 = local_20 + L'\x01') {
      for (; local_24 <= bx2; local_24 = local_24 + L'\x01') {
        if ((dun->room_map[local_20][local_24] & 1U) != 0) {
          return false;
        }
      }
    }
    bx1_local._3_1_ = true;
  }
  return bx1_local._3_1_;
}

Assistant:

static bool check_for_unreserved_blocks(int by1, int bx1, int by2, int bx2)
{
	int by, bx;

	/* Never run off the screen */
	if (by1 < 0 || by2 >= dun->row_blocks) return false;
	if (bx1 < 0 || bx2 >= dun->col_blocks) return false;

	/* Verify open space */
	for (by = by1; by <= by2; by++) {
		for (bx = bx1; bx <= bx2; bx++) {
			if (dun->room_map[by][bx]) return false;
		}
	}
	return true;
}